

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression_type.cpp
# Opt level: O2

string * __thiscall
duckdb::CompressionTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,CompressionType type)

{
  InternalException *this_00;
  undefined7 in_register_00000011;
  char *pcVar1;
  allocator local_39;
  string local_38;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar1 = "Auto";
    break;
  case 1:
    pcVar1 = "Uncompressed";
    break;
  case 2:
    pcVar1 = "Constant";
    break;
  case 3:
    pcVar1 = "RLE";
    break;
  case 4:
    pcVar1 = "Dictionary";
    break;
  case 5:
    pcVar1 = "PFOR";
    break;
  case 6:
    pcVar1 = "BitPacking";
    break;
  case 7:
    pcVar1 = "FSST";
    break;
  case 8:
    pcVar1 = "Chimp";
    break;
  case 9:
    pcVar1 = "Patas";
    break;
  case 10:
    pcVar1 = "ALP";
    break;
  case 0xb:
    pcVar1 = "ALPRD";
    break;
  case 0xc:
    pcVar1 = "ZSTD";
    break;
  case 0xd:
    pcVar1 = "Roaring";
    break;
  case 0xe:
    pcVar1 = "Empty Validity";
    break;
  default:
    this_00 = (InternalException *)
              __cxa_allocate_exception(0x10,this,CONCAT71(in_register_00000011,type));
    ::std::__cxx11::string::string((string *)&local_38,"Unrecognized compression type!",&local_39);
    InternalException::InternalException(this_00,&local_38);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string CompressionTypeToString(CompressionType type) {
	switch (type) {
	case CompressionType::COMPRESSION_AUTO:
		return "Auto";
	case CompressionType::COMPRESSION_UNCOMPRESSED:
		return "Uncompressed";
	case CompressionType::COMPRESSION_CONSTANT:
		return "Constant";
	case CompressionType::COMPRESSION_RLE:
		return "RLE";
	case CompressionType::COMPRESSION_DICTIONARY:
		return "Dictionary";
	case CompressionType::COMPRESSION_PFOR_DELTA:
		return "PFOR";
	case CompressionType::COMPRESSION_BITPACKING:
		return "BitPacking";
	case CompressionType::COMPRESSION_FSST:
		return "FSST";
	case CompressionType::COMPRESSION_CHIMP:
		return "Chimp";
	case CompressionType::COMPRESSION_PATAS:
		return "Patas";
	case CompressionType::COMPRESSION_ZSTD:
		return "ZSTD";
	case CompressionType::COMPRESSION_ALP:
		return "ALP";
	case CompressionType::COMPRESSION_ALPRD:
		return "ALPRD";
	case CompressionType::COMPRESSION_ROARING:
		return "Roaring";
	case CompressionType::COMPRESSION_EMPTY:
		return "Empty Validity";
	default:
		throw InternalException("Unrecognized compression type!");
	}
}